

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O1

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>::
keyboard_did_change_key(ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *this)

{
  undefined1 in_CL;
  int in_EDX;
  
  if (in_EDX == 0) {
    *(undefined1 *)
     &(this->keyboard_).essential_modifiers_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         in_CL;
  }
  else {
    if (in_EDX != 0x39) {
      return;
    }
    *(undefined1 *)
     ((long)&(this->keyboard_).essential_modifiers_._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left + 1) = in_CL;
  }
  return;
}

Assistant:

bool keyboard_did_change_key(Inputs::Keyboard *, Inputs::Keyboard::Key key, bool is_pressed) final {
			if(key == Inputs::Keyboard::Key::Enter) {
				pause_is_pressed_ = is_pressed;
				return true;
			}

			if(key == Inputs::Keyboard::Key::Escape) {
				reset_is_pressed_ = is_pressed;
				return true;
			}

			return false;
		}